

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  ostream *poVar2;
  Version *version;
  Session *this_local;
  
  poVar1 = cout();
  poVar2 = std::operator<<((ostream *)poVar1,"\nCatch v");
  version = libraryVersion();
  poVar1 = Catch::operator<<((ostream *)poVar2,version);
  poVar2 = std::operator<<((ostream *)poVar1,"\n");
  poVar1 = clara::detail::operator<<((ostream *)poVar2,&this->m_cli);
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"For more detailed usage please see the project docs\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch v" << libraryVersion() << "\n"
                << m_cli << std::endl
                << "For more detailed usage please see the project docs\n" << std::endl;
    }